

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void QPDFObjectHandle::warn(QPDF *qpdf,QPDFExc *e)

{
  QPDFExc *this;
  
  if (qpdf != (QPDF *)0x0) {
    QPDF::warn(qpdf,e);
    return;
  }
  this = (QPDFExc *)__cxa_allocate_exception(0x80);
  QPDFExc::QPDFExc(this,e);
  __cxa_throw(this,&QPDFExc::typeinfo,QPDFExc::~QPDFExc);
}

Assistant:

void
QPDFObjectHandle::warn(QPDF* qpdf, QPDFExc const& e)
{
    // If parsing on behalf of a QPDF object and want to give a warning, we can warn through the
    // object. If parsing for some other reason, such as an explicit creation of an object from a
    // string, then just throw the exception.
    if (qpdf) {
        qpdf->warn(e);
    } else {
        throw e;
    }
}